

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

bool __thiscall
basist::ktx2_transcoder::get_image_level_info
          (ktx2_transcoder *this,ktx2_image_level_info *level_info,uint32_t level_index,
          uint32_t layer_index,uint32_t face_index)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ktx2_etc1s_image_desc *pkVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  
  if (level_index < (this->m_levels).m_size) {
    if (*(uint *)(this->m_header).m_face_count.m_bytes < 2) {
      if (face_index != 0) {
        return false;
      }
    }
    else if (5 < face_index) {
      return false;
    }
    iVar2 = *(int *)(this->m_header).m_layer_count.m_bytes;
    if (layer_index < iVar2 + (uint)(iVar2 == 0)) {
      uVar5 = *(uint *)(this->m_header).m_pixel_width.m_bytes >> ((byte)level_index & 0x1f);
      uVar6 = uVar5 + (uVar5 == 0);
      uVar5 = *(uint *)(this->m_header).m_pixel_height.m_bytes >> ((byte)level_index & 0x1f);
      uVar7 = uVar5 + (uVar5 == 0);
      uVar5 = uVar6 + 3;
      uVar8 = uVar5 >> 2;
      uVar1 = uVar7 + 3;
      uVar3 = uVar1 >> 2;
      level_info->m_face_index = face_index;
      level_info->m_layer_index = layer_index;
      level_info->m_level_index = level_index;
      level_info->m_orig_width = uVar6;
      level_info->m_orig_height = uVar7;
      level_info->m_width = uVar5 & 0xfffffffc;
      level_info->m_height = uVar1 & 0xfffffffc;
      level_info->m_num_blocks_x = uVar8;
      level_info->m_num_blocks_y = uVar3;
      level_info->m_total_blocks = uVar3 * uVar8;
      level_info->m_alpha_flag = this->m_has_alpha;
      level_info->m_iframe_flag = false;
      if ((this->m_etc1s_image_descs).m_size != 0) {
        iVar2 = *(int *)(this->m_header).m_layer_count.m_bytes;
        pkVar4 = basisu::vector<basist::ktx2_etc1s_image_desc>::operator[]
                           (&this->m_etc1s_image_descs,
                            (ulong)(((iVar2 + (uint)(iVar2 == 0)) * level_index + layer_index) *
                                    *(int *)(this->m_header).m_face_count.m_bytes + face_index));
        level_info->m_iframe_flag = ((pkVar4->m_image_flags).m_bytes[0] & 2) == 0;
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ktx2_transcoder::get_image_level_info(ktx2_image_level_info& level_info, uint32_t level_index, uint32_t layer_index, uint32_t face_index) const
	{
		if (level_index >= m_levels.size())
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: level_index >= m_levels.size()\n");
			return false;
		}

		if (m_header.m_face_count > 1)
		{
			if (face_index >= 6)
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: face_index >= 6\n");
				return false;
			}
		}
		else if (face_index != 0)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: face_index != 0\n");
			return false;
		}

		if (layer_index >= basisu::maximum<uint32_t>(m_header.m_layer_count, 1))
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::get_image_level_info: layer_index >= maximum<uint32_t>(m_header.m_layer_count, 1)\n");
			return false;
		}
				
		const uint32_t level_width = basisu::maximum<uint32_t>(m_header.m_pixel_width >> level_index, 1);
		const uint32_t level_height = basisu::maximum<uint32_t>(m_header.m_pixel_height >> level_index, 1);
		const uint32_t num_blocks_x = (level_width + 3) >> 2;
		const uint32_t num_blocks_y = (level_height + 3) >> 2;

		level_info.m_face_index = face_index;
		level_info.m_layer_index = layer_index;
		level_info.m_level_index = level_index;
		level_info.m_orig_width = level_width;
		level_info.m_orig_height = level_height;
		level_info.m_width = num_blocks_x * 4;
		level_info.m_height = num_blocks_y * 4;
		level_info.m_num_blocks_x = num_blocks_x;
		level_info.m_num_blocks_y = num_blocks_y;
		level_info.m_total_blocks = num_blocks_x * num_blocks_y;
		level_info.m_alpha_flag = m_has_alpha;
		level_info.m_iframe_flag = false;
		if (m_etc1s_image_descs.size())
		{
			const uint32_t etc1s_image_index =
				(level_index * basisu::maximum<uint32_t>(m_header.m_layer_count, 1) * m_header.m_face_count) +
				layer_index * m_header.m_face_count +
				face_index;

			level_info.m_iframe_flag = (m_etc1s_image_descs[etc1s_image_index].m_image_flags & KTX2_IMAGE_IS_P_FRAME) == 0;
		}

		return true;
	}